

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

bool __thiscall
QWidgetTextControl::setFocusToAnchor(QWidgetTextControl *this,QTextCursor *newCursor)

{
  long lVar1;
  MoveMode MVar2;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QRectF local_98;
  QRectF local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if ((*(byte *)(lVar1 + 0xb0) & 8) == 0) {
    bVar4 = false;
  }
  else {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QWidgetTextControlPrivate::anchorForCursor
              ((QString *)&local_58,(QWidgetTextControlPrivate *)newCursor,newCursor);
    bVar4 = (undefined1 *)local_58.size != (undefined1 *)0x0;
    if (bVar4) {
      local_78.w = -NAN;
      local_78.h = -NAN;
      local_78.xp = -NAN;
      local_78.yp = -NAN;
      selectionRect(&local_78,this);
      updateRequest(this,&local_78);
      iVar3 = (int)lVar1 + 0x88;
      MVar2 = QTextCursor::selectionStart();
      QTextCursor::setPosition(iVar3,MVar2);
      MVar2 = QTextCursor::selectionEnd();
      QTextCursor::setPosition(iVar3,MVar2);
      *(undefined1 *)(lVar1 + 0x90) = 1;
      selectionRect(&local_98,this);
      local_78.w = local_98.w;
      local_78.h = local_98.h;
      local_78.xp = local_98.xp;
      local_78.yp = local_98.yp;
      updateRequest(this,&local_78);
      visibilityRequest(this,&local_78);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetTextControl::setFocusToAnchor(const QTextCursor &newCursor)
{
    Q_D(QWidgetTextControl);

    if (!(d->interactionFlags & Qt::LinksAccessibleByKeyboard))
        return false;

    // Verify that this is an anchor.
    const QString anchorHref = d->anchorForCursor(newCursor);
    if (anchorHref.isEmpty())
        return false;

    // and process it
    QRectF crect = selectionRect();
    emit updateRequest(crect);

    d->cursor.setPosition(newCursor.selectionStart());
    d->cursor.setPosition(newCursor.selectionEnd(), QTextCursor::KeepAnchor);
    d->cursorIsFocusIndicator = true;

    crect = selectionRect();
    emit updateRequest(crect);
    emit visibilityRequest(crect);
    return true;
}